

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  byte bVar2;
  mtree *mtree;
  bool bVar3;
  __mode_t p;
  wchar_t wVar4;
  wchar_t wVar5;
  mode_t mVar6;
  int iVar7;
  mtree_entry *pmVar8;
  int *piVar9;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar10;
  archive_string *paVar11;
  ushort **ppuVar12;
  size_t sVar13;
  mtree_entry **ppmVar14;
  archive_rb_node *paVar15;
  archive_rb_node *paVar16;
  size_t len;
  mtree_entry *pmVar17;
  ulong uVar18;
  la_int64_t lVar19;
  char *pcVar20;
  mtree_entry *pmVar21;
  char *pcVar22;
  size_t sVar23;
  __dev_t _Var24;
  ulong uVar25;
  archive_entry *rbt;
  char *pcVar26;
  mtree_option **global_00;
  char cVar27;
  uint uVar28;
  byte *pbVar29;
  long lVar30;
  undefined1 *puVar31;
  mtree_entry *pmVar32;
  mtree_entry *pmVar33;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat_conflict1 st_storage;
  long local_120;
  archive_entry *local_118;
  wchar_t local_10c;
  mtree_entry *local_108;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  archive_entry *local_f0;
  ulong local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar25 = 0xffffffe2;
      goto LAB_007691e5;
    }
    local_f0 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_118 = (archive_entry *)0x0;
    detect_form(a,(wchar_t *)&local_d0);
    local_120 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_d8 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_007689d7:
      lVar30 = 0;
      uVar18 = 0;
      do {
        _Var24 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_007691d2;
        pvVar10 = memchr(__s,10,local_c0.st_dev);
        if (pvVar10 != (void *)0x0) {
          _Var24 = (long)pvVar10 + (1 - (long)__s);
          local_c0.st_dev = _Var24;
        }
        if (0xffff < (long)(_Var24 + uVar18)) {
          pcVar20 = "Line too long";
          iVar7 = 0x54;
          goto LAB_007691cb;
        }
        paVar11 = archive_string_ensure((archive_string *)mtree,_Var24 + uVar18 + 1);
        if (paVar11 == (archive_string *)0x0) {
          pcVar20 = "Can\'t allocate working buffer";
          iVar7 = 0xc;
          goto LAB_007691cb;
        }
        memcpy((mtree->line).s + uVar18,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        uVar25 = local_c0.st_dev + uVar18;
        (mtree->line).s[uVar25] = '\0';
        pmVar8 = (mtree_entry *)(mtree->line).s;
        pbVar29 = (byte *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
LAB_00768a70:
        bVar1 = *pbVar29;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar10 == (void *)0x0) goto LAB_00768aae;
          }
          else {
            if (bVar1 == 0) goto LAB_00768aae;
            if (bVar1 == 10) {
              if (uVar25 == 0) break;
              if (-1 < (long)uVar25) {
                lVar30 = 0;
                pmVar32 = pmVar8;
                goto LAB_00768b07;
              }
              free_options((mtree_option *)local_118);
              entry = local_f0;
              if ((int)uVar25 != 0) goto LAB_007691e5;
              goto LAB_00768578;
            }
          }
LAB_00768aa6:
          pbVar29 = pbVar29 + 1;
          goto LAB_00768a70;
        }
        if ((bVar1 != 0x5c) || (pbVar29[1] == 0)) goto LAB_00768aa6;
        if (pbVar29[1] != 10) {
          pbVar29 = pbVar29 + 1;
          goto LAB_00768aa6;
        }
        *(char *)((long)(pmVar8->rbnode).rb_nodes + (uVar25 - 2)) = '\0';
        uVar25 = uVar25 - 2;
        pmVar8 = (mtree_entry *)(mtree->line).s;
LAB_00768aae:
        lVar30 = (long)pbVar29 - (long)pmVar8;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar18 = uVar25;
      } while (__s != (void *)0x0);
    }
LAB_0076900e:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_118);
    entry = local_f0;
  }
LAB_00768578:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar8 = mtree->this_entry;
  uVar25 = 1;
  if (pmVar8 != (mtree_entry *)0x0) {
    paVar11 = &mtree->current_dir;
    rbt = (archive_entry *)&mtree->rbtree;
    local_f0 = rbt;
    do {
      pcVar20 = pmVar8->name;
      if (((*pcVar20 == '.') && (pcVar20[1] == '.')) && (pcVar20[2] == '\0')) {
        pmVar8->used = '\x01';
        sVar23 = (mtree->current_dir).length;
        if (sVar23 != 0) {
          pcVar20 = paVar11->s;
          pcVar22 = pcVar20 + sVar23;
          do {
            pcVar26 = pcVar22;
            pcVar22 = pcVar26 + -1;
            if (pcVar22 < pcVar20) break;
          } while (*pcVar22 != '/');
          pcVar26 = pcVar26 + -2;
          if (pcVar22 < pcVar20) {
            pcVar26 = pcVar22;
          }
          (mtree->current_dir).length = (size_t)(pcVar26 + (1 - (long)pcVar20));
        }
      }
      else if (pmVar8->used == '\0') {
        pmVar8->used = '\x01';
        local_118 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_10c = L'\0';
        wVar4 = parse_line(a,entry,mtree,pmVar8,&local_10c);
        if (pmVar8->full == '\0') {
          sVar23 = (mtree->current_dir).length;
          if (sVar23 != 0) {
            archive_strcat(paVar11,"/");
          }
          archive_strcat(paVar11,pmVar8->name);
          archive_entry_copy_pathname(entry,paVar11->s);
          mVar6 = archive_entry_filetype(entry);
          rbt = local_f0;
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar23;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar8->name);
          for (pmVar8 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)rbt,pmVar8->name);
              pmVar8 != (mtree_entry *)0x0; pmVar8 = pmVar8->next_dup) {
            if ((pmVar8->full != '\0') && (pmVar8->used == '\0')) {
              pmVar8->used = '\x01';
              wVar5 = parse_line(a,entry,mtree,pmVar8,&local_10c);
              if (wVar5 < wVar4) {
                wVar4 = wVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_00769161:
          lVar19 = archive_entry_size(entry);
          mtree->cur_size = lVar19;
          mtree->offset = 0;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar20 = archive_entry_pathname(entry);
          }
          else {
            pcVar20 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
            wVar5 = open(pcVar20,0x80000);
            mtree->fd = wVar5;
            __archive_ensure_cloexec_flag(wVar5);
            wVar5 = mtree->fd;
            if (wVar5 == L'\xffffffff') {
              piVar9 = __errno_location();
              if ((*piVar9 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar9,"Can\'t open %s",pcVar20);
                wVar4 = L'\xffffffec';
              }
              goto LAB_00768771;
            }
          }
          else {
LAB_00768771:
            wVar5 = mtree->fd;
          }
          if (wVar5 < L'\0') {
            iVar7 = lstat(pcVar20,&local_c0);
            if (iVar7 != -1) goto LAB_007687ca;
LAB_00768802:
            if ((local_10c & 0x800U) == 0) goto LAB_00769161;
LAB_0076891d:
            pmVar8 = mtree->this_entry;
            goto LAB_00768926;
          }
          iVar7 = fstat(wVar5,&local_c0);
          if (iVar7 == -1) {
            piVar9 = __errno_location();
            archive_set_error(&a->archive,*piVar9,"Could not fstat %s",pcVar20);
            close(mtree->fd);
            mtree->fd = L'\xffffffff';
            wVar4 = L'\xffffffec';
            goto LAB_00768802;
          }
LAB_007687ca:
          p = local_c0.st_mode;
          uVar28 = local_c0.st_mode & 0xf000;
          if (uVar28 == 0xa000) {
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 != 0xa000) goto LAB_0076886c;
LAB_0076902e:
            wVar5 = local_10c;
            if (((local_10c & 0x1001U) != 1) &&
               ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
                (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((wVar5 & 0xcU) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((wVar5 & 0x600U) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((wVar5 & 0x1010U) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((wVar5 & 0x1020U) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((wVar5 & 0x1040U) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((wVar5 & 0x1080U) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_118,&local_d0);
            entry = local_118;
            goto LAB_00769161;
          }
          if ((uVar28 == 0x8000) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0x8000))
          goto LAB_0076902e;
LAB_0076886c:
          if (((~p & 0xc000) == 0) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0xc000))
          goto LAB_0076902e;
          switch(uVar28 - 0x1000 >> 0xc) {
          case 0:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x1000) goto LAB_0076902e;
            break;
          case 1:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x2000) goto LAB_0076902e;
            break;
          case 3:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x4000) goto LAB_0076902e;
            break;
          case 5:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x6000) goto LAB_0076902e;
          }
          if (L'\xffffffff' < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = L'\xffffffff';
          if ((local_10c & 0x800U) != 0) goto LAB_0076891d;
          if (wVar4 == L'\0') {
            pcVar20 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar20
                             );
            wVar4 = L'\xffffffec';
          }
        }
        uVar25 = (ulong)(uint)wVar4;
        goto LAB_007691e5;
      }
LAB_00768926:
      pmVar8 = pmVar8->next;
      mtree->this_entry = pmVar8;
    } while (pmVar8 != (mtree_entry *)0x0);
    uVar25 = 1;
  }
LAB_007691e5:
  return (wchar_t)uVar25;
LAB_00768b07:
  pmVar32 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + 1);
  bVar1 = *(byte *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
  uVar25 = (ulong)bVar1;
  if (0x23 < uVar25) goto LAB_00768b62;
  if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_00768b36;
    goto LAB_00768b62;
  }
  lVar30 = lVar30 + 1;
  goto LAB_00768b07;
LAB_00768b62:
  pmVar17 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
  uVar25 = (local_c0.st_dev + uVar18) - lVar30;
  pmVar33 = (mtree_entry *)((long)pmVar17 + (uVar25 - 1));
  if (pmVar17 < pmVar33) {
    local_100 = pmVar17;
    local_e8 = uVar25;
    ppuVar12 = __ctype_b_loc();
    pmVar21 = local_100;
    do {
      bVar2 = *(byte *)(pmVar21->rbnode).rb_nodes;
      if ((bVar2 != 9) && (((*ppuVar12)[bVar2] & 0x4000) == 0)) goto LAB_007691fa;
      pmVar21 = (mtree_entry *)((long)(pmVar21->rbnode).rb_nodes + 1);
      uVar25 = local_e8;
      pmVar17 = local_100;
    } while (pmVar21 < pmVar33);
  }
  wVar4 = (wchar_t)local_d0;
  if (bVar1 != 0x2f) {
    local_100 = pmVar17;
    local_e8 = uVar25;
    local_e0 = (mtree_entry *)malloc(0x40);
    if (local_e0 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e0->options + 2) = 0;
      *(undefined8 *)((long)&local_e0->name + 2) = 0;
      local_e0->next = (mtree_entry *)0x0;
      local_e0->options = (mtree_option *)0x0;
      ppmVar14 = &local_f8->next;
      if (local_f8 == (mtree_entry *)0x0) {
        ppmVar14 = local_c8;
      }
      *ppmVar14 = local_e0;
      local_108 = local_e0;
      if (wVar4 != L'\0') {
        uVar25 = local_e8;
        local_f8 = local_100;
        if (0 < (long)local_e8) {
LAB_00768d6e:
          uVar18 = (ulong)*(byte *)(pmVar33->rbnode).rb_nodes;
          if ((uVar18 < 0x21) && ((0x100002600U >> (uVar18 & 0x3f) & 1) != 0))
          goto code_r0x00768d86;
          uVar18 = 0;
          do {
            if (((ulong)(byte)pmVar32[-1].field_0x3f < 0x21) &&
               ((0x100002600U >> ((ulong)(byte)pmVar32[-1].field_0x3f & 0x3f) & 1) != 0)) {
              local_f8 = pmVar32;
            }
            uVar18 = uVar18 + 1;
            pmVar32 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + 1);
          } while (uVar25 != uVar18);
        }
        goto LAB_00768da0;
      }
      pcVar20 = (char *)strcspn((char *)local_100," \t\r\n");
      pmVar8 = (mtree_entry *)(pcVar20 + (long)((long)(pmVar8->rbnode).rb_nodes + lVar30));
      local_f8 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + local_e8);
      goto LAB_00768e83;
    }
    goto LAB_0076923a;
  }
  if (4 < (long)uVar25) {
    iVar7 = strncmp((char *)pmVar17,"/set",4);
    if (iVar7 == 0) {
      cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 4);
      if ((cVar27 == ' ') || (cVar27 == '\t')) {
        pcVar20 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 4);
        while (sVar13 = strspn(pcVar20," \t\r\n"), pcVar20[sVar13] != '\0') {
          pcVar26 = pcVar20 + sVar13;
          sVar13 = strcspn(pcVar26," \t\r\n");
          pcVar20 = pcVar26 + sVar13;
          pcVar22 = strchr(pcVar26,0x3d);
          sVar23 = (long)pcVar22 - (long)pcVar26;
          if (pcVar20 < pcVar22) {
            sVar23 = sVar13;
          }
          remove_option((mtree_option **)&local_118,pcVar26,sVar23);
          wVar4 = add_option(a,(mtree_option **)&local_118,pcVar26,sVar13);
          uVar25 = (ulong)(uint)wVar4;
          if (wVar4 != L'\0') goto LAB_007691d8;
        }
        goto LAB_00768b36;
      }
      goto LAB_007691fa;
    }
    if (((uVar25 < 7) || (iVar7 = strncmp((char *)pmVar17,"/unset",6), iVar7 != 0)) ||
       ((cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6), cVar27 != ' ' &&
        (cVar27 != '\t')))) goto LAB_007691fa;
    pcVar22 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6);
    pcVar20 = strchr(pcVar22,0x3d);
    if (pcVar20 == (char *)0x0) {
      sVar13 = strspn(pcVar22," \t\r\n");
      cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6 + sVar13);
      if (cVar27 != '\0') {
        pcVar20 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + sVar13 + 6);
        do {
          sVar13 = strcspn(pcVar20," \t\r\n");
          sVar23 = sVar13;
          if (sVar13 == 3) {
            if (((cVar27 != 'a') || (pcVar20[1] != 'l')) || (pcVar20[2] != 'l')) {
              sVar23 = 3;
              goto LAB_00768cd7;
            }
            free_options((mtree_option *)local_118);
            local_118 = (archive_entry *)0x0;
          }
          else {
LAB_00768cd7:
            remove_option((mtree_option **)&local_118,pcVar20,sVar23);
          }
          pcVar20 = pcVar20 + sVar13;
          sVar13 = strspn(pcVar20," \t\r\n");
          cVar27 = pcVar20[sVar13];
          pcVar20 = pcVar20 + sVar13;
        } while (cVar27 != '\0');
      }
      goto LAB_00768b36;
    }
    pcVar20 = "/unset shall not contain `=\'";
    iVar7 = -1;
    goto LAB_007691cb;
  }
LAB_007691fa:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_120);
LAB_007691d2:
  uVar25 = 0xffffffe2;
LAB_007691d8:
  free_options((mtree_option *)local_118);
  goto LAB_007691e5;
code_r0x00768d86:
  pmVar33 = (mtree_entry *)&pmVar33[-1].field_0x3f;
  bVar3 = (long)uVar25 < 2;
  uVar25 = uVar25 - 1;
  if (bVar3) goto code_r0x00768d96;
  goto LAB_00768d6e;
code_r0x00768d96:
  uVar25 = 0;
LAB_00768da0:
  pcVar20 = (char *)((long)pmVar8 + lVar30 + (uVar25 - (long)local_f8));
  pmVar8 = local_100;
  local_100 = local_f8;
LAB_00768e83:
  pmVar32 = local_108;
  pcVar22 = (char *)malloc((size_t)(pcVar20 + 1));
  pmVar32->name = pcVar22;
  if (pcVar22 != (char *)0x0) {
    memcpy(pcVar22,local_100,(size_t)pcVar20);
    pcVar22[(long)pcVar20] = '\0';
    parse_escapes(pcVar22,pmVar32);
    pmVar17 = local_e0;
    pmVar32->next_dup = (mtree_entry *)0x0;
    if (((pmVar32->full != '\0') &&
        (iVar7 = __archive_rb_tree_insert_node(local_d8,&pmVar32->rbnode), iVar7 == 0)) &&
       (paVar15 = __archive_rb_tree_find_node(local_d8,pmVar32->name),
       paVar15 != (archive_rb_node *)0x0)) {
      do {
        paVar16 = paVar15;
        paVar15 = paVar16[1].rb_nodes[0];
      } while (paVar15 != (archive_rb_node *)0x0);
      paVar16[1].rb_nodes[0] = &pmVar32->rbnode;
    }
    global_00 = &pmVar17->options;
    puVar31 = (undefined1 *)&local_118;
    while (puVar31 = *(undefined1 **)puVar31, puVar31 != (undefined1 *)0x0) {
      pcVar20 = *(char **)((long)puVar31 + 8);
      sVar13 = strlen(pcVar20);
      wVar4 = add_option(a,global_00,pcVar20,sVar13);
      if (wVar4 != L'\0') goto LAB_00769218;
    }
    while ((sVar13 = strspn((char *)pmVar8," \t\r\n"),
           *(char *)((long)(pmVar8->rbnode).rb_nodes + sVar13) != '\0' &&
           (pmVar32 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + sVar13), pmVar32 < local_f8)
           )) {
      len = strcspn((char *)pmVar32," \t\r\n");
      pmVar8 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + len);
      pmVar17 = (mtree_entry *)strchr((char *)pmVar32,0x3d);
      sVar13 = (long)pmVar17 - (long)pmVar32;
      if (pmVar8 < pmVar17) {
        sVar13 = len;
      }
      if (pmVar17 == (mtree_entry *)0x0) {
        sVar13 = len;
      }
      remove_option(global_00,(char *)pmVar32,sVar13);
      wVar4 = add_option(a,global_00,(char *)pmVar32,len);
      if (wVar4 != L'\0') goto LAB_00769218;
    }
    local_f8 = local_108;
LAB_00768b36:
    local_120 = local_120 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_0076900e;
    goto LAB_007689d7;
  }
LAB_0076923a:
  piVar9 = __errno_location();
  iVar7 = *piVar9;
  pcVar20 = "Can\'t allocate memory";
LAB_007691cb:
  archive_set_error(&a->archive,iVar7,pcVar20);
  goto LAB_007691d2;
LAB_00769218:
  uVar25 = (ulong)(uint)wVar4;
  goto LAB_007691d8;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
#endif
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}